

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

void __thiscall QProcessPrivate::QProcessPrivate(QProcessPrivate *this)

{
  Channel *in_RDI;
  QIODevicePrivate *unaff_retaddr;
  Initialization in_stack_ffffffffffffffec;
  
  QIODevicePrivate::QIODevicePrivate(unaff_retaddr,(QtPrivate_6_10_0)((ulong)in_RDI >> 0x20));
  (in_RDI->file).d.d = (Data *)&PTR__QProcessPrivate_00bebc30;
  Channel::Channel(in_RDI);
  Channel::Channel(in_RDI);
  Channel::Channel(in_RDI);
  QString::QString((QString *)0x78f5a3);
  QList<QString>::QList((QList<QString> *)0x78f5b4);
  QString::QString((QString *)0x78f5c5);
  QProcessEnvironment::QProcessEnvironment((QProcessEnvironment *)in_RDI,in_stack_ffffffffffffffec);
  std::unique_ptr<QProcessPrivate::UnixExtras,std::default_delete<QProcessPrivate::UnixExtras>>::
  unique_ptr<std::default_delete<QProcessPrivate::UnixExtras>,void>
            ((unique_ptr<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
              *)in_RDI);
  in_RDI[0xb].notifier = (QSocketNotifier *)0x0;
  in_RDI[0xb].pipe[0] = -1;
  in_RDI[0xb].pipe[1] = -1;
  in_RDI[0xb].type = Normal;
  in_RDI[0xb].closed = false;
  in_RDI[0xb].append = false;
  in_RDI[0xb].field_0x33 = 0;
  *(undefined4 *)&in_RDI[0xb].field_0x34 = 0xffffffff;
  *(undefined4 *)&in_RDI[0xc].file.d.d = 0;
  *(undefined1 *)((long)&in_RDI[0xc].file.d.d + 4) = 0;
  *(undefined1 *)((long)&in_RDI[0xc].file.d.d + 5) = 0;
  *(undefined1 *)((long)&in_RDI[0xc].file.d.d + 6) = 5;
  *(undefined1 *)((long)&in_RDI[0xc].file.d.d + 7) = 0;
  *(undefined1 *)&in_RDI[0xc].file.d.ptr = 0;
  *(undefined1 *)((long)&in_RDI[0xc].file.d.ptr + 1) = 0;
  *(undefined1 *)((long)&in_RDI[0xc].file.d.ptr + 2) = 0;
  *(undefined4 *)&in_RDI[3].file.d.size = 0x1000;
  *(undefined4 *)((long)&in_RDI[3].file.d.size + 4) = 0x1000;
  return;
}

Assistant:

QProcessPrivate::QProcessPrivate()
{
    readBufferChunkSize = QRINGBUFFER_CHUNKSIZE;
#ifndef Q_OS_WIN
    writeBufferChunkSize = QRINGBUFFER_CHUNKSIZE;
#endif
}